

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugLine::Row::Row(Row *this,bool DefaultIsStmt)

{
  (this->Address).Address = 0;
  (this->Address).SectionIndex = 0xffffffffffffffff;
  this->Line = 1;
  this->Column = 0;
  this->File = 1;
  this->Isa = '\0';
  this->Discriminator = 0;
  this->field_0x1d = this->field_0x1d & 0xe0 | DefaultIsStmt;
  return;
}

Assistant:

void DWARFDebugLine::Row::postAppend() {
  Discriminator = 0;
  BasicBlock = false;
  PrologueEnd = false;
  EpilogueBegin = false;
}